

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,uint16_t reliableSequenceNumber,uint8_t channelID)

{
  ushort *puVar1;
  _ENetListNode **pp_Var2;
  byte *pbVar3;
  ENetList *pEVar4;
  ENetChannel *pEVar5;
  byte bVar6;
  short sVar7;
  _ENetListNode *p_Var8;
  _ENetListNode *p_Var9;
  bool bVar10;
  bool bVar11;
  
  pEVar4 = &peer->sentReliableCommands;
  p_Var8 = (peer->sentReliableCommands).sentinel.next;
  bVar10 = p_Var8 == &pEVar4->sentinel;
  if (bVar10) {
    p_Var9 = (_ENetListNode *)0x0;
  }
  else {
    do {
      p_Var9 = p_Var8;
      if ((*(uint16_t *)&p_Var9[1].next == reliableSequenceNumber) &&
         (*(uint8_t *)((long)&p_Var9[2].previous + 1) == channelID)) break;
      bVar10 = p_Var9->next == &pEVar4->sentinel;
      p_Var8 = p_Var9->next;
    } while (!bVar10);
  }
  if (bVar10) {
    for (p_Var8 = (peer->outgoingCommands).sentinel.next;
        bVar11 = p_Var8 != &(peer->outgoingCommands).sentinel, bVar11; p_Var8 = p_Var8->next) {
      if (*(short *)((long)&p_Var8[2].next + 6) == 0) goto LAB_001086ee;
      p_Var9 = p_Var8;
      if ((*(uint16_t *)&p_Var8[1].next == reliableSequenceNumber) &&
         (*(uint8_t *)((long)&p_Var8[2].previous + 1) == channelID)) break;
    }
    if (bVar11) goto LAB_00108639;
  }
  else {
LAB_00108639:
    if (p_Var9 != (_ENetListNode *)0x0) {
      if ((ulong)channelID < peer->channelCount) {
        pEVar5 = peer->channels;
        sVar7 = *(short *)((long)pEVar5->reliableWindows +
                          (ulong)(reliableSequenceNumber >> 0xc) * 2 +
                          (ulong)((uint)channelID * 0x50));
        if ((sVar7 != 0) &&
           (sVar7 = sVar7 + -1,
           *(short *)((long)pEVar5->reliableWindows +
                     (ulong)(reliableSequenceNumber >> 0xc) * 2 + (ulong)((uint)channelID * 0x50)) =
                sVar7, sVar7 == 0)) {
          bVar6 = (byte)(reliableSequenceNumber >> 0xc);
          puVar1 = (ushort *)((long)pEVar5->reliableWindows + ((ulong)((uint)channelID * 0x50) - 2))
          ;
          *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffeU >> 0x10 - bVar6);
        }
      }
      bVar6 = *(byte *)&p_Var9[2].previous;
      p_Var8 = p_Var9->previous;
      p_Var8->next = p_Var9->next;
      p_Var9->next->previous = p_Var8;
      p_Var8 = p_Var9[5].previous;
      if (p_Var8 != (_ENetListNode *)0x0) {
        if (!bVar10) {
          peer->reliableDataInTransit =
               peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var9[2].next + 4);
        }
        pp_Var2 = &p_Var8[1].previous;
        *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
        if (*(int *)pp_Var2 == 0) {
          pbVar3 = (byte *)((long)&p_Var8->next + 1);
          *pbVar3 = *pbVar3 | 1;
          if (p_Var8[1].next != (_ENetListNode *)0x0) {
            (*(code *)p_Var8[1].next)(p_Var8);
          }
          (*(code *)callbacks_1)(p_Var8);
        }
      }
      bVar6 = bVar6 & 0xf;
      (*(code *)callbacks_1)(p_Var9);
      p_Var8 = (pEVar4->sentinel).next;
      if (p_Var8 != &pEVar4->sentinel) {
        peer->nextTimeout = *(int *)&p_Var8[1].previous + *(int *)((long)&p_Var8[1].next + 4);
      }
      goto LAB_001086f0;
    }
  }
LAB_001086ee:
  bVar6 = 0;
LAB_001086f0:
  return (ENetProtocolCommand)bVar6;
}

Assistant:

static ENetProtocolCommand enet_protocol_remove_sent_reliable_command(ENetPeer* peer, uint16_t reliableSequenceNumber, uint8_t channelID) {
	ENetOutgoingCommand* outgoingCommand = NULL;
	ENetListIterator currentCommand;
	ENetProtocolCommand commandNumber;

	int wasSent = 1;

	for (currentCommand = enet_list_begin(&peer->sentReliableCommands); currentCommand != enet_list_end(&peer->sentReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
			break;
	}

	if (currentCommand == enet_list_end(&peer->sentReliableCommands)) {
		for (currentCommand = enet_list_begin(&peer->outgoingCommands); currentCommand != enet_list_end(&peer->outgoingCommands); currentCommand = enet_list_next(currentCommand)) {
			outgoingCommand = (ENetOutgoingCommand*)currentCommand;

			if (outgoingCommand->sendAttempts < 1)
				return ENET_PROTOCOL_COMMAND_NONE;

			if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
				break;
		}

		if (currentCommand == enet_list_end(&peer->outgoingCommands))
			return ENET_PROTOCOL_COMMAND_NONE;

		wasSent = 0;
	}

	if (outgoingCommand == NULL)
		return ENET_PROTOCOL_COMMAND_NONE;

	if (channelID < peer->channelCount) {
		ENetChannel* channel = &peer->channels[channelID];
		uint16_t reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

		if (channel->reliableWindows[reliableWindow] > 0) {
			--channel->reliableWindows[reliableWindow];

			if (!channel->reliableWindows[reliableWindow])
				channel->usedReliableWindows &= ~(1 << reliableWindow);
		}
	}

	commandNumber = (ENetProtocolCommand)(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK);

	enet_list_remove(&outgoingCommand->outgoingCommandList);

	if (outgoingCommand->packet != NULL) {
		if (wasSent)
			peer->reliableDataInTransit -= outgoingCommand->fragmentLength;

		--outgoingCommand->packet->referenceCount;

		if (outgoingCommand->packet->referenceCount == 0) {
			outgoingCommand->packet->flags |= ENET_PACKET_FLAG_SENT;

			enet_packet_destroy(outgoingCommand->packet);
		}
	}

	enet_free(outgoingCommand);

	if (enet_list_empty(&peer->sentReliableCommands))
		return commandNumber;

	outgoingCommand = (ENetOutgoingCommand*)enet_list_front(&peer->sentReliableCommands);
	peer->nextTimeout = outgoingCommand->sentTime + outgoingCommand->roundTripTimeout;

	return commandNumber;
}